

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

void __thiscall Employee::Employee(Employee *this,Employee *employee)

{
  uint uVar1;
  Employee *employee_local;
  Employee *this_local;
  
  Person::Person(&this->super_Person,&employee->super_Person);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_0010ad28;
  this->hourWork = employee->hourWork;
  this->salaryPerHour = employee->salaryPerHour;
  this->workToDo = employee->workToDo;
  this->workDone = employee->workDone;
  uVar1 = (**(this->super_Person)._vptr_Person)();
  if ((uVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"invalid id");
    exit(1);
  }
  return;
}

Assistant:

Employee::Employee(const Employee &employee) : Person(employee) {
    hourWork = employee.hourWork;
    salaryPerHour = employee.salaryPerHour;
    workToDo = employee.workToDo;
    workDone = employee.workDone;
    if(!validate())
    {cout<<"invalid id";
        exit(1);
    }

}